

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::DecodeRawTransactionRequest::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *in_stack_fffffffffffffd48;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *in_stack_fffffffffffffd50;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *this;
  char (*in_stack_fffffffffffffd58) [8];
  char (*__args) [10];
  function<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>
  *in_stack_fffffffffffffd60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
  *this_00;
  undefined1 local_231 [49];
  char local_200 [103];
  allocator local_199;
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  string local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
                   *)0x4ad193);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffd50);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionRequest_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&)>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionRequest_ptr
                *)in_stack_fffffffffffffd58);
    std::function<void(cfd::api::json::DecodeRawTransactionRequest&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionRequest&,UniValue_const&),void>
              (in_stack_fffffffffffffd60,
               (_func_void_DecodeRawTransactionRequest_ptr_UniValue_ptr *)in_stack_fffffffffffffd58)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::operator=
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffd50);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
                        *)in_stack_fffffffffffffd60,(char (*) [4])in_stack_fffffffffffffd58,
                       in_stack_fffffffffffffd50);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"hex",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionRequest_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&)>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionRequest_ptr
                *)in_stack_fffffffffffffd58);
    std::function<void(cfd::api::json::DecodeRawTransactionRequest&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionRequest&,UniValue_const&),void>
              (in_stack_fffffffffffffd60,
               (_func_void_DecodeRawTransactionRequest_ptr_UniValue_ptr *)in_stack_fffffffffffffd58)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::operator=
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffd50);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
                        *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                       in_stack_fffffffffffffd50);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"network",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    __args = (char (*) [10])local_200;
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionRequest_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&)>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionRequest_ptr
                *)__args);
    std::function<void(cfd::api::json::DecodeRawTransactionRequest&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionRequest&,UniValue_const&),void>
              (in_stack_fffffffffffffd60,
               (_func_void_DecodeRawTransactionRequest_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::operator=
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffd50);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
            ::
            emplace<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>&>
                      (this_00,__args,in_stack_fffffffffffffd50);
    local_231._33_8_ = pVar2.first._M_node;
    local_231[0x29] = pVar2.second;
    this = (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)local_231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_231 + 1),"iswitness",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)in_stack_fffffffffffffd48);
    std::__cxx11::string::~string((string *)(local_231 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_231);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::~CLASS_FUNCTION_TABLE
              (this);
  }
  return;
}

Assistant:

void DecodeRawTransactionRequest::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<DecodeRawTransactionRequest> func_table;  // NOLINT

  func_table = {
    DecodeRawTransactionRequest::GetHexString,
    DecodeRawTransactionRequest::SetHexString,
    DecodeRawTransactionRequest::GetHexFieldType,
  };
  json_mapper.emplace("hex", func_table);
  item_list.push_back("hex");
  func_table = {
    DecodeRawTransactionRequest::GetNetworkString,
    DecodeRawTransactionRequest::SetNetworkString,
    DecodeRawTransactionRequest::GetNetworkFieldType,
  };
  json_mapper.emplace("network", func_table);
  item_list.push_back("network");
  func_table = {
    DecodeRawTransactionRequest::GetIswitnessString,
    DecodeRawTransactionRequest::SetIswitnessString,
    DecodeRawTransactionRequest::GetIswitnessFieldType,
  };
  json_mapper.emplace("iswitness", func_table);
  item_list.push_back("iswitness");
}